

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O1

void MoveRegression(void)

{
  return;
}

Assistant:

void MoveRegression()
{
	#if CPLUSPLUS_STD == CPLUSPLUS_17
	#include <variant>
	#include <string>

	template<typename... T>
	class Union {
	public:
		Union() = default;
		Union& operator=(Union&&) noexcept = default;

		template<typename F>
		Union& operator=(F&& t) {
			value = std::forward<F>(t);
			return *this;
		}

		std::variant<T...> value;
	};

	Union<std::string, SafeInt<int64_t>> x;
	Union<std::string, SafeInt<int64_t>> y;
	x = std::move(y);
	#endif
}